

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintWithFallback<std::unordered_set<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>>
               (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *value,
               ostream *os)

{
  ostream *os_local;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *value_local;
  
  ContainerPrinter::
  PrintValue<std::unordered_set<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>,void>
            (value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}